

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_user_version_check(png_structrp png_ptr,png_const_charp user_png_ver)

{
  size_t sVar1;
  bool bVar2;
  char local_b8 [8];
  char m [128];
  size_t pos;
  int found_dots;
  int i;
  png_const_charp user_png_ver_local;
  png_structrp png_ptr_local;
  
  if (user_png_ver == (png_const_charp)0x0) {
    png_ptr->flags = png_ptr->flags | 0x20000;
  }
  else {
    pos._4_4_ = -1;
    pos._0_4_ = 0;
    do {
      pos._4_4_ = pos._4_4_ + 1;
      if (user_png_ver[pos._4_4_] != "1.6.44"[pos._4_4_]) {
        png_ptr->flags = png_ptr->flags | 0x20000;
      }
      if (user_png_ver[pos._4_4_] == '.') {
        pos._0_4_ = (int)pos + 1;
      }
      bVar2 = false;
      if (((int)pos < 2) && (bVar2 = false, user_png_ver[pos._4_4_] != '\0')) {
        bVar2 = "1.6.44"[pos._4_4_] != '\0';
      }
    } while (bVar2);
  }
  bVar2 = (png_ptr->flags & 0x20000) == 0;
  if (!bVar2) {
    sVar1 = png_safecat(local_b8,0x80,0,"Application built with libpng-");
    sVar1 = png_safecat(local_b8,0x80,sVar1,user_png_ver);
    sVar1 = png_safecat(local_b8,0x80,sVar1," but running with ");
    png_safecat(local_b8,0x80,sVar1,"1.6.44");
    png_warning(png_ptr,local_b8);
  }
  png_ptr_local._4_4_ = (uint)bVar2;
  return png_ptr_local._4_4_;
}

Assistant:

int
png_user_version_check(png_structrp png_ptr, png_const_charp user_png_ver)
{
   /* Libpng versions 1.0.0 and later are binary compatible if the version
    * string matches through the second '.'; we must recompile any
    * applications that use any older library version.
    */

   if (user_png_ver != NULL)
   {
      int i = -1;
      int found_dots = 0;

      do
      {
         i++;
         if (user_png_ver[i] != PNG_LIBPNG_VER_STRING[i])
            png_ptr->flags |= PNG_FLAG_LIBRARY_MISMATCH;
         if (user_png_ver[i] == '.')
            found_dots++;
      } while (found_dots < 2 && user_png_ver[i] != 0 &&
            PNG_LIBPNG_VER_STRING[i] != 0);
   }

   else
      png_ptr->flags |= PNG_FLAG_LIBRARY_MISMATCH;

   if ((png_ptr->flags & PNG_FLAG_LIBRARY_MISMATCH) != 0)
   {
#ifdef PNG_WARNINGS_SUPPORTED
      size_t pos = 0;
      char m[128];

      pos = png_safecat(m, (sizeof m), pos,
          "Application built with libpng-");
      pos = png_safecat(m, (sizeof m), pos, user_png_ver);
      pos = png_safecat(m, (sizeof m), pos, " but running with ");
      pos = png_safecat(m, (sizeof m), pos, PNG_LIBPNG_VER_STRING);
      PNG_UNUSED(pos)

      png_warning(png_ptr, m);
#endif

#ifdef PNG_ERROR_NUMBERS_SUPPORTED
      png_ptr->flags = 0;
#endif

      return 0;
   }

   /* Success return. */
   return 1;
}